

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::checkBindTargetParams
          (Compilation *this,BindDirectiveSyntax *syntax,Scope *scope,ResolvedBind *resolvedBind)

{
  size_type sVar1;
  pointer ppSVar2;
  long lVar3;
  SmallVector<const_slang::ast::Symbol_*,_5UL> *__range2;
  anon_class_16_2_6b548e5c doCheck;
  anon_class_16_2_6b548e5c local_40;
  
  sVar1 = (resolvedBind->instTargets).super_SmallVectorBase<const_slang::ast::Symbol_*>.len;
  local_40.syntax = syntax;
  local_40.scope = scope;
  if (sVar1 != 0) {
    ppSVar2 = (resolvedBind->instTargets).super_SmallVectorBase<const_slang::ast::Symbol_*>.data_;
    lVar3 = 0;
    do {
      checkBindTargetParams::anon_class_16_2_6b548e5c::operator()
                (&local_40,*(InstanceBodySymbol **)(*(long *)((long)ppSVar2 + lVar3) + 0x50));
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  if (resolvedBind->defTarget != (DefinitionSymbol *)0x0) {
    checkBindTargetParams();
  }
  return;
}

Assistant:

void Compilation::checkBindTargetParams(const syntax::BindDirectiveSyntax& syntax,
                                        const Scope& scope, const ResolvedBind& resolvedBind) {
    // This method checks the following rule from the LRM:
    //    User-defined type names that are used to override type parameters must be
    //    visible and matching in both the scope containing the bind statement and in
    //    the target scope.
    auto doCheck = [&](const InstanceBodySymbol& container) {
        if (syntax.instantiation->kind == SyntaxKind::CheckerInstantiation)
            return;

        for (auto instSyntax : syntax.instantiation->as<HierarchyInstantiationSyntax>().instances) {
            if (!instSyntax->decl)
                continue;

            auto sym = container.find(instSyntax->decl->name.valueText());
            if (!sym || sym->kind != SymbolKind::Instance || sym->getSyntax() != instSyntax)
                continue;

            auto& inst = sym->as<InstanceSymbol>();
            for (auto param : inst.body.getParameters()) {
                if (param->symbol.kind == SymbolKind::TypeParameter) {
                    auto& typeParam = param->symbol.as<TypeParameterSymbol>();
                    auto& type = typeParam.targetType.getType();
                    if (typeParam.isOverridden() && type.isAlias() && !type.name.empty()) {
                        // This is the case we need to check; the resolved type is
                        // a named type alias, so we need to also resolve it in the bind
                        // directive scope and make sure they match.
                        auto result = Lookup::unqualified(scope, type.name, LookupFlags::Type);
                        if (!result || !result->isType()) {
                            auto ts = typeParam.getDeclaredType()->getTypeSyntax();
                            SLANG_ASSERT(ts);
                            scope.addDiag(diag::BindTypeParamNotFound, ts->sourceRange())
                                << typeParam.name << type;
                        }
                        else if (!result->as<Type>().isMatching(type)) {
                            auto ts = typeParam.getDeclaredType()->getTypeSyntax();
                            SLANG_ASSERT(ts);
                            scope.addDiag(diag::BindTypeParamMismatch, ts->sourceRange())
                                << typeParam.name << result->as<Type>() << type;
                        }
                    }
                }
            }
        }
    };

    for (auto target : resolvedBind.instTargets)
        doCheck(target->as<InstanceSymbol>().body);

    if (resolvedBind.defTarget) {
        auto it = instancesWithDefBinds.find(resolvedBind.defTarget);
        if (it != instancesWithDefBinds.end()) {
            for (auto target : it->second)
                doCheck(target->as<InstanceBodySymbol>());
        }
    }
}